

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_16::BinaryReaderObjdump::InitExprToConstOffset
          (BinaryReaderObjdump *this,InitExpr *expr,uint32_t *out_offset)

{
  InitExprType IVar1;
  pointer this_00;
  uint32_t *out_offset_local;
  InitExpr *expr_local;
  BinaryReaderObjdump *this_local;
  
  IVar1 = expr->type;
  if (IVar1 == I32) {
    *out_offset = (expr->value).index;
  }
  else {
    if (IVar1 - F32 < 4) {
LAB_0015e579:
      this_00 = std::unique_ptr<wabt::FileStream,_std::default_delete<wabt::FileStream>_>::
                operator->(&(this->super_BinaryReaderObjdumpBase).err_stream_);
      Stream::Writef(&this_00->super_Stream,"Segment/Elem offset must be an i32 init expr");
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    if (IVar1 == Global) {
      *out_offset = 0;
    }
    else if (IVar1 - FuncRef < 2) goto LAB_0015e579;
  }
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderObjdump::InitExprToConstOffset(const InitExpr& expr,
                                                  uint32_t* out_offset) {
  switch (expr.type) {
    case InitExprType::I32:
      *out_offset = expr.value.i32;
      break;
    case InitExprType::Global:
      *out_offset = 0;
      break;
    case InitExprType::I64:
    case InitExprType::F32:
    case InitExprType::F64:
    case InitExprType::V128:
    case InitExprType::FuncRef:
    case InitExprType::NullRef:
      err_stream_->Writef("Segment/Elem offset must be an i32 init expr");
      return Result::Error;
      break;
  }
  return Result::Ok;
}